

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::finalizeMemory(TranslateToFuzzReader *this)

{
  bool bVar1;
  reference this_00;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *this_01;
  pointer pDVar2;
  size_type a;
  reference ppGVar3;
  Importable *this_02;
  Const *pCVar4;
  long lVar5;
  pointer pMVar6;
  Address *pAVar7;
  address64_t aVar8;
  pointer pMVar9;
  address64_t aVar10;
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  *this_03;
  Name *pNVar11;
  Name NVar12;
  Name local_110;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *local_100;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *memory_1;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  *__range2;
  Address local_d8;
  Address local_d0;
  Address local_c8;
  Address ONE_GB;
  Const *offset;
  Literal local_b0;
  char *local_88;
  char *pcStack_80;
  GlobalGet *local_78;
  GlobalGet *get;
  iterator __end4;
  iterator __begin4;
  vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_> *__range4;
  Address maxOffset;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *segment;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
  *__range1;
  value_type *memory;
  TranslateToFuzzReader *this_local;
  
  this_00 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::operator[](&this->wasm->memories,0);
  this_01 = &this->wasm->dataSegments;
  __end1 = std::
           vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ::begin(this_01);
  segment = (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
            std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
                                *)&segment);
    if (!bVar1) {
      pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      pAVar7 = std::max<wasm::Address>
                         (&pMVar6->initial,&(this->fuzzParams->super_FuzzParams).USABLE_MEMORY);
      pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      (pMVar6->initial).addr = pAVar7->addr;
      pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      aVar8 = Address::operator_cast_to_unsigned_long(&pMVar6->max);
      if (aVar8 == 0xffffffffffffffff) {
        pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (this_00);
        pMVar9 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (this_00);
        (pMVar9->max).addr = (pMVar6->initial).addr;
      }
      pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      aVar8 = Address::operator_cast_to_unsigned_long(&pMVar6->max);
      pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      aVar10 = Address::operator_cast_to_unsigned_long(&pMVar6->initial);
      if (aVar8 <= aVar10) {
        pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (this_00);
        aVar8 = Address::operator_cast_to_unsigned_long(&pMVar6->initial);
        Address::Address(&local_d8,aVar8 + 1);
        Address::Address((Address *)&__range2,0x10000);
        pAVar7 = std::min<wasm::Address>(&local_d8,(Address *)&__range2);
        pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (this_00);
        (pMVar6->max).addr = pAVar7->addr;
      }
      if ((this->preserveImportsAndExports & 1U) == 0) {
        this_03 = &this->wasm->memories;
        __end2 = std::
                 vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ::begin(this_03);
        memory_1 = (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                   std::
                   vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ::end(this_03);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
                                           *)&memory_1), bVar1) {
          local_100 = __gnu_cxx::
                      __normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
                      ::operator*(&__end2);
          Name::Name(&local_110);
          pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                             (local_100);
          pNVar11 = Name::operator=(&(pMVar6->super_Importable).base,&local_110);
          pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                             (local_100);
          Name::operator=(&(pMVar6->super_Importable).module,pNVar11);
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
          ::operator++(&__end2);
        }
      }
      return;
    }
    maxOffset.addr =
         (address64_t)
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
         ::operator*(&__end1);
    pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                        maxOffset.addr);
    a = std::vector<char,_std::allocator<char>_>::size(&pDVar2->data);
    Address::Address((Address *)&__range4,a);
    pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                        maxOffset.addr);
    if ((pDVar2->isPassive & 1U) == 0) {
      bVar1 = FeatureSet::hasGC(&this->wasm->features);
      if (!bVar1) {
        pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                 operator->((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                             *)maxOffset.addr);
        FindAll<wasm::GlobalGet>::FindAll((FindAll<wasm::GlobalGet> *)&__begin4,pDVar2->offset);
        __end4 = std::vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>::begin
                           ((vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_> *)
                            &__begin4);
        get = (GlobalGet *)
              std::vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>::end
                        ((vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_> *)&__begin4)
        ;
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<wasm::GlobalGet_**,_std::vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>_>
                                           *)&get), bVar1) {
          ppGVar3 = __gnu_cxx::
                    __normal_iterator<wasm::GlobalGet_**,_std::vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>_>
                    ::operator*(&__end4);
          local_78 = *ppGVar3;
          local_88 = (char *)(local_78->name).super_IString.str._M_len;
          pcStack_80 = (local_78->name).super_IString.str._M_str;
          NVar12.super_IString.str._M_str = local_88;
          NVar12.super_IString.str._M_len = (size_t)this->wasm;
          this_02 = (Importable *)wasm::Module::getGlobal(NVar12);
          bVar1 = Importable::imported(this_02);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            __assert_fail("!wasm.getGlobal(get->name)->imported()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                          ,0x2f2,"void wasm::TranslateToFuzzReader::finalizeMemory()");
          }
          pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                             (this_00);
          Literal::makeFromInt32(&local_b0,0,(Type)(pMVar6->addressType).id);
          pCVar4 = Builder::makeConst(&this->builder,&local_b0);
          pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
                   operator->((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                               *)maxOffset.addr);
          pDVar2->offset = (Expression *)pCVar4;
          wasm::Literal::~Literal(&local_b0);
          __gnu_cxx::
          __normal_iterator<wasm::GlobalGet_**,_std::vector<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>_>
          ::operator++(&__end4);
        }
        FindAll<wasm::GlobalGet>::~FindAll((FindAll<wasm::GlobalGet> *)&__begin4);
      }
      pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::
               operator->((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                          maxOffset.addr);
      ONE_GB.addr = (address64_t)Expression::dynCast<wasm::Const>(pDVar2->offset);
      if ((Const *)ONE_GB.addr != (Const *)0x0) {
        aVar8 = Address::operator_cast_to_unsigned_long((Address *)&__range4);
        lVar5 = wasm::Literal::getInteger();
        Address::operator=((Address *)&__range4,aVar8 + lVar5);
      }
    }
    Address::Address(&local_c8,0x40000000);
    aVar8 = Address::operator_cast_to_unsigned_long((Address *)&__range4);
    aVar10 = Address::operator_cast_to_unsigned_long(&local_c8);
    if (aVar8 <= aVar10) {
      pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      aVar8 = Address::operator_cast_to_unsigned_long((Address *)&__range4);
      Address::Address(&local_d0,aVar8 + 0xffff >> 0x10);
      pAVar7 = std::max<wasm::Address>(&pMVar6->initial,&local_d0);
      pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      (pMVar6->initial).addr = pAVar7->addr;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_*,_std::vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void TranslateToFuzzReader::finalizeMemory() {
  auto& memory = wasm.memories[0];
  for (auto& segment : wasm.dataSegments) {
    Address maxOffset = segment->data.size();
    if (!segment->isPassive) {
      if (!wasm.features.hasGC()) {
        // Using a non-imported global in a segment offset is not valid in wasm
        // unless GC is enabled. This can occur due to us adding a local
        // definition to what used to be an imported global in initial contents.
        // To fix that, replace such invalid offsets with a constant.
        for ([[maybe_unused]] auto* get :
             FindAll<GlobalGet>(segment->offset).list) {
          // No imported globals should remain.
          assert(!wasm.getGlobal(get->name)->imported());
          // TODO: It would be better to avoid segment overlap so that
          //       MemoryPacking can run.
          segment->offset =
            builder.makeConst(Literal::makeFromInt32(0, memory->addressType));
        }
      }
      if (auto* offset = segment->offset->dynCast<Const>()) {
        maxOffset = maxOffset + offset->value.getInteger();
      }
    }

    // Ensure the initial memory can fit the segment (so we don't just trap),
    // but only do so when the segment is at a reasonable offset (to avoid
    // validation errors on the initial size >= 4GB in wasm32, but also to
    // avoid OOM errors on trying to allocate too much initial memory, which is
    // annoying in the fuzzer).
    Address ONE_GB = 1024 * 1024 * 1024;
    if (maxOffset <= ONE_GB) {
      memory->initial = std::max(
        memory->initial,
        Address((maxOffset + Memory::kPageSize - 1) / Memory::kPageSize));
    }
  }
  memory->initial = std::max(memory->initial, fuzzParams->USABLE_MEMORY);
  // Avoid an unlimited memory size, which would make fuzzing very difficult
  // as different VMs will run out of system memory in different ways.
  if (memory->max == Memory::kUnlimitedSize) {
    memory->max = memory->initial;
  }
  if (memory->max <= memory->initial) {
    // To allow growth to work (which a testcase may assume), try to make the
    // maximum larger than the initial.
    // TODO: scan the wasm for grow instructions?
    memory->max =
      std::min(Address(memory->initial + 1), Address(Memory::kMaxSize32));
  }

  if (!preserveImportsAndExports) {
    // Avoid an imported memory (which the fuzz harness would need to handle).
    for (auto& memory : wasm.memories) {
      memory->module = memory->base = Name();
    }
  }
}